

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderSetV2iAttribute(ImfHeader *hdr,char *name,int x,int y)

{
  Vec2<int> VVar1;
  Iterator IVar2;
  iterator iVar3;
  TypedAttribute<Imath_3_2::Vec2<int>_> *pTVar4;
  V2i v;
  Vec2<int> local_30;
  TypedAttribute<Imath_3_2::Vec2<int>_> local_28;
  
  local_30.x = x;
  local_30.y = y;
  IVar2 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar3._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar2._i._M_node == (iterator)iVar3._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::TypedAttribute(&local_28,&local_30);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_28.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::~TypedAttribute(&local_28);
  }
  else {
    pTVar4 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
                       ((Header *)hdr,name);
    VVar1.y = local_30.y;
    VVar1.x = local_30.x;
    pTVar4->_value = VVar1;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetV2iAttribute (ImfHeader* hdr, const char name[], int x, int y)
{
    try
    {
        V2i v (x, y);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute (v));
        else
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute> (
                    name)
                .value () = v;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}